

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

size_t __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
::expires_at(basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
             *this,time_point *expiry_time)

{
  service_type *err;
  size_t sVar1;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RSI;
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  *in_RDI;
  size_t s;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  error_code *in_stack_ffffffffffffffd8;
  time_type *in_stack_ffffffffffffffe0;
  implementation_type *in_stack_ffffffffffffffe8;
  
  CLI::std::error_code::error_code(in_stack_ffffffffffffffd0);
  err = asio::detail::
        io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
        ::get_service(in_RDI);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_implementation(in_RDI);
  sVar1 = asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::expires_at(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       in_stack_ffffffffffffffd8);
  asio::detail::throw_error((error_code *)err,(char *)in_RDI);
  return sVar1;
}

Assistant:

std::size_t expires_at(const time_point& expiry_time)
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().expires_at(
        impl_.get_implementation(), expiry_time, ec);
    asio::detail::throw_error(ec, "expires_at");
    return s;
  }